

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pingpong_test.c
# Opt level: O1

void mu_cv_ping_pong(ping_pong *pp,int parity)

{
  nsync_mu_lock(&pp->mu);
  if (pp->i < pp->limit) {
    do {
      while ((pp->i & 1U) == parity) {
        nsync_cv_wait(pp->cv + (uint)parity,&pp->mu);
      }
      pp->i = pp->i + 1;
      nsync_cv_signal(pp->cv + (1 - parity));
    } while (pp->i < pp->limit);
  }
  nsync_mu_unlock(&pp->mu);
  ping_pong_done(pp);
  return;
}

Assistant:

static void mu_cv_ping_pong (ping_pong *pp, int parity) {
	nsync_mu_lock (&pp->mu);
	while (pp->i < pp->limit) {
		while ((pp->i & 1) == parity) {
			nsync_cv_wait (&pp->cv[parity], &pp->mu);
		}
		pp->i++;
		nsync_cv_signal (&pp->cv[1-parity]);
	}
	nsync_mu_unlock (&pp->mu);
	ping_pong_done (pp);
}